

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void check_duplex<float>(float *input_buffer,float *output_buffer,long frame_count,
                        int input_channel_count)

{
  bool bVar1;
  stringstream *this;
  AssertHelperData *pAVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  char *message;
  float fVar6;
  AssertionResult gtest_ar;
  AssertHelper local_68;
  AssertionResult local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [2];
  AssertHelper local_40;
  long local_38;
  
  local_50[0].ptr_._0_4_ = 0x100;
  local_38 = frame_count;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_60,"frame_count","256",&local_38,(int *)local_50);
  if (local_60.success_ == false) {
    this = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this);
    *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    local_50[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x2ad,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50[0].ptr_ + 8))();
      }
      local_50[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_60.success_ = output_buffer != (float *)0x0;
    local_60.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (output_buffer == (float *)0x0) {
      pAVar2 = (AssertHelperData *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)pAVar2);
      *(undefined8 *)((long)&(pAVar2->message).c_str_ + *(long *)(*(long *)&pAVar2->line + -0x18)) =
           0x11;
      local_68.data_ = pAVar2;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_50,&local_60,"!!output_buffer","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x2af,(char *)local_50[0].ptr_);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_50[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_50[0].ptr_);
      }
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
        local_68.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_60.success_ = input_buffer != (float *)0x0;
      local_60.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (input_buffer == (float *)0x0) {
        pAVar2 = (AssertHelperData *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)pAVar2);
        *(undefined8 *)((long)&(pAVar2->message).c_str_ + *(long *)(*(long *)&pAVar2->line + -0x18))
             = 0x11;
        local_68.data_ = pAVar2;
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)local_50,&local_60,"!!input_buffer","false","true");
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                   ,0x2b0,(char *)local_50[0].ptr_);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (local_50[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_50[0].ptr_);
        }
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
          local_68.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (0 < local_38) {
          pfVar3 = input_buffer + 1;
          uVar4 = 0;
          do {
            if (input_channel_count == 2) {
              output_buffer[uVar4] = pfVar3[-1];
              fVar6 = *pfVar3;
              uVar5 = uVar4 | 1;
LAB_0010d566:
              output_buffer[uVar5] = fVar6;
            }
            else if (input_channel_count == 1) {
              fVar6 = *(float *)((long)input_buffer + uVar4 * 2);
              output_buffer[uVar4 + 1] = fVar6;
              uVar5 = uVar4;
              goto LAB_0010d566;
            }
            uVar4 = uVar4 + 2;
            pfVar3 = pfVar3 + input_channel_count;
            local_38 = local_38 + -1;
          } while (local_38 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void check_duplex(const T * input_buffer,
                  T * output_buffer, long frame_count,
                  int input_channel_count)
{
  ASSERT_EQ(frame_count, 256);
  // Silence scan-build warning.
  ASSERT_TRUE(!!output_buffer); assert(output_buffer);
  ASSERT_TRUE(!!input_buffer); assert(input_buffer);

  int output_index = 0;
  int input_index = 0;
  for (int i = 0; i < frame_count; i++) {
    // output is two channels, input one or two channels.
    if (input_channel_count == 1) {
      output_buffer[output_index] = output_buffer[output_index + 1] = input_buffer[i];
    } else if (input_channel_count == 2) {
      output_buffer[output_index] = input_buffer[input_index];
      output_buffer[output_index + 1] = input_buffer[input_index + 1];
    }
    output_index += 2;
    input_index += input_channel_count;
  }
}